

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O3

void __thiscall deqp::gls::LifetimeTests::details::LifeTest::testDelete(LifeTest *this)

{
  uint uVar1;
  int iVar2;
  ResultCollector errors;
  ResultCollector local_30;
  
  local_30.m_testCtx = (this->super_TestBase).super_TestCase.super_TestNode.m_testCtx;
  local_30.m_log = (local_30.m_testCtx)->m_log;
  local_30.m_result = QP_TEST_RESULT_PASS;
  local_30.m_message = "Pass";
  uVar1 = (*this->m_type->_vptr_Type[2])();
  (*this->m_type->_vptr_Type[3])(this->m_type,(ulong)uVar1);
  iVar2 = (*this->m_type->_vptr_Type[4])(this->m_type,(ulong)uVar1);
  if ((char)iVar2 != '\0') {
    ResultCollector::addResult(&local_30,QP_TEST_RESULT_FAIL,"Object still exists after deletion");
  }
  ResultCollector::~ResultCollector(&local_30);
  return;
}

Assistant:

void LifeTest::testDelete (void)
{
	ResultCollector	errors	(getTestContext());
	GLuint			name	= m_type.gen();

	m_type.release(name);
	errors.check(!m_type.exists(name), "Object still exists after deletion");
}